

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

int canvas_scanbinbuf(int natoms,t_atom *vec,int *p_indexout,int *p_next)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int indexwas;
  int i;
  int *p_next_local;
  int *p_indexout_local;
  t_atom *vec_local;
  int natoms_local;
  
  iVar1 = *p_next;
  *p_indexout = iVar1;
  local_2c = iVar1;
  if (iVar1 < natoms) {
    while( true ) {
      bVar2 = false;
      if (local_2c < natoms) {
        bVar2 = vec[local_2c].a_type != A_SEMI;
      }
      if (!bVar2) break;
      local_2c = local_2c + 1;
    }
    if (local_2c < natoms) {
      *p_next = local_2c + 1;
    }
    else {
      *p_next = local_2c;
    }
    vec_local._4_4_ = local_2c - iVar1;
  }
  else {
    vec_local._4_4_ = 0;
  }
  return vec_local._4_4_;
}

Assistant:

static int canvas_scanbinbuf(int natoms, t_atom *vec, int *p_indexout,
    int *p_next)
{
    int i;
    int indexwas = *p_next;
    *p_indexout = indexwas;
    if (indexwas >= natoms)
        return (0);
    for (i = indexwas; i < natoms && vec[i].a_type != A_SEMI; i++)
        ;
    if (i >= natoms)
        *p_next = i;
    else *p_next = i + 1;
    return (i - indexwas);
}